

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O2

optional<CPubKey> * __thiscall
(anonymous_namespace)::KeyConverter::FromString<char_const*>
          (optional<CPubKey> *__return_storage_ptr__,void *this,char *first,char *last)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  string_view hex_str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  Key key;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key.vch._0_8_ = key.vch + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&key);
  hex_str._M_str = (char *)key.vch._0_8_;
  hex_str._M_len._0_1_ = key.vch[8];
  hex_str._M_len._1_1_ = key.vch[9];
  hex_str._M_len._2_1_ = key.vch[10];
  hex_str._M_len._3_1_ = key.vch[0xb];
  hex_str._M_len._4_1_ = key.vch[0xc];
  hex_str._M_len._5_1_ = key.vch[0xd];
  hex_str._M_len._6_1_ = key.vch[0xe];
  hex_str._M_len._7_1_ = key.vch[0xf];
  ParseHex<unsigned_char>(&bytes,hex_str);
  std::__cxx11::string::~string((string *)&key);
  CPubKey::
  Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&key,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   )bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  if (((key.vch[0] & 0xfe) == 2) ||
     ((bVar2 = false, key.vch[0] < 8 && ((0xd0U >> (key.vch[0] & 0x1f) & 1) != 0)))) {
    memcpy(__return_storage_ptr__,&key,0x41);
    bVar2 = true;
  }
  (__return_storage_ptr__->super__Optional_base<CPubKey,_true,_true>)._M_payload.
  super__Optional_payload_base<CPubKey>._M_engaged = bVar2;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<Key> FromString(I first, I last) const {
        auto bytes = ParseHex(std::string(first, last));
        Key key{bytes.begin(), bytes.end()};
        if (key.IsValid()) return key;
        return {};
    }